

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_30::AsyncStreamFd::tryReadInternal
          (AsyncStreamFd *this,void *buffer,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  PromiseNode *pPVar1;
  int iVar2;
  PromiseFulfiller<void> *pPVar3;
  TransformPromiseNodeBase *pTVar4;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_00;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_01;
  ImmediatePromiseNode<unsigned_long> *pIVar5;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_02;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_03;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_04;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX_05;
  Disposer *in_R9;
  Disposer *minBytes_00;
  int iVar6;
  AsyncStreamFd *pAVar7;
  bool bVar8;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar9;
  Own<kj::_::ChainPromiseNode> OVar10;
  Promise<unsigned_long> PVar11;
  Fault f;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Disposer *local_58;
  PromiseFulfiller<void> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  AsyncStreamFd *local_38;
  
  iVar6 = 0;
  local_58 = in_R9;
  local_50 = (PromiseFulfiller<void> *)maxBytes;
  local_38 = this;
  do {
    pPVar3 = (PromiseFulfiller<void> *)
             read(*(int *)((long)buffer + 0x10),(void *)minBytes,alreadyRead);
    if (-1 < (long)pPVar3) {
      iVar2 = 0;
      pIVar5 = extraout_RDX;
      break;
    }
    iVar2 = kj::_::Debug::getOsErrorNumber(true);
    pIVar5 = extraout_RDX_00;
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    local_78.disposer = (Disposer *)0x0;
    local_48 = (Disposer *)0x0;
    uStack_40 = (PromiseFulfiller<void> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_78,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_78);
    iVar6 = 5;
    pIVar5 = extraout_RDX_01;
  }
  pAVar7 = local_38;
  if (iVar6 == 0) {
    if ((long)pPVar3 < 0) {
      UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_68);
      pTVar4 = (TransformPromiseNodeBase *)operator_new(0x50);
      pAVar7 = local_38;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar4,&local_68,
                 kj::_::
                 TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:329:50),_kj::_::PropagateException>
                 ::anon_class_40_5_00d635ec_for_func::operator());
      (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00650ca0;
      pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
      pTVar4[1].dependency.disposer = (Disposer *)minBytes;
      pTVar4[1].dependency.ptr = (PromiseNode *)local_50;
      pTVar4[1].continuationTracePtr = (void *)alreadyRead;
      pTVar4[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_58;
      local_78.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#2},kj::_::PropagateException>>
            ::instance;
      local_78.ptr = (PromiseNode *)pTVar4;
      OVar10 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_78);
      pPVar1 = local_78.ptr;
      pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar10.ptr;
      *(undefined4 *)
       &(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (undefined4)local_48;
      *(undefined4 *)
       ((long)&(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
               _vptr_AsyncInputStream + 4) = local_48._4_4_;
      *(undefined4 *)
       &(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
        _vptr_AsyncOutputStream = (undefined4)uStack_40;
      *(undefined4 *)
       ((long)&(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
               _vptr_AsyncOutputStream + 4) = uStack_40._4_4_;
      if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
        local_78.ptr = (PromiseNode *)0x0;
        (**(local_78.disposer)->_vptr_Disposer)
                  (local_78.disposer,
                   ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                   (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
        pIVar5 = extraout_RDX_04;
      }
      pPVar1 = local_68.ptr;
      if (local_68.ptr != (PromiseNode *)0x0) {
        local_68.ptr = (PromiseNode *)0x0;
        (**((EventPort *)&(local_68.disposer)->_vptr_Disposer)->_vptr_EventPort)
                  (local_68.disposer,
                   pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
        pIVar5 = extraout_RDX_05;
      }
      goto LAB_0048db7e;
    }
    if (pPVar3 == (PromiseFulfiller<void> *)0x0) goto LAB_0048db55;
    bVar8 = pPVar3 <= local_50;
    local_50 = (PromiseFulfiller<void> *)((long)local_50 - (long)pPVar3);
    if (bVar8 && local_50 != (PromiseFulfiller<void> *)0x0) {
      minBytes_00 = (Disposer *)((long)&pPVar3->_vptr_PromiseFulfiller + minBytes);
      if (*(char *)((long)buffer + 0x70) != '\x01') {
        PVar11 = tryReadInternal(local_38,buffer,(size_t)minBytes_00,(size_t)local_50,
                                 alreadyRead - (long)pPVar3);
        pIVar5 = PVar11.super_PromiseBase.node.ptr;
        goto LAB_0048db7e;
      }
      if ((*(byte *)((long)buffer + 0x71) & 1) == 0) {
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&local_68);
        pTVar4 = (TransformPromiseNodeBase *)operator_new(0x50);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar4,&local_68,
                   kj::_::
                   TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:359:54),_kj::_::PropagateException>
                   ::anon_class_40_5_00d635ec_for_func::operator());
        (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00650d28;
        pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)buffer;
        pTVar4[1].dependency.disposer = minBytes_00;
        pTVar4[1].dependency.ptr = (PromiseNode *)local_50;
        pTVar4[1].continuationTracePtr = (void *)(alreadyRead - (long)pPVar3);
        pTVar4[2].super_PromiseNode._vptr_PromiseNode =
             (_func_int **)
             ((long)&local_58->_vptr_Disposer + (long)&(pPVar3 + -10)[10]._vptr_PromiseFulfiller);
        local_78.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReadInternal(void*,unsigned_long,unsigned_long,unsigned_long)::{lambda()#3},kj::_::PropagateException>>
              ::instance;
        local_78.ptr = (PromiseNode *)pTVar4;
        OVar10 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                           ((kj *)&local_48,&local_78);
        pPVar1 = local_78.ptr;
        pIVar5 = (ImmediatePromiseNode<unsigned_long> *)OVar10.ptr;
        *(undefined4 *)
         &(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
          _vptr_AsyncInputStream = (undefined4)local_48;
        *(undefined4 *)
         ((long)&(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
                 _vptr_AsyncInputStream + 4) = local_48._4_4_;
        *(undefined4 *)
         &(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
          _vptr_AsyncOutputStream = (undefined4)uStack_40;
        *(undefined4 *)
         ((long)&(pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
                 _vptr_AsyncOutputStream + 4) = uStack_40._4_4_;
        if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
          local_78.ptr = (PromiseNode *)0x0;
          (**(local_78.disposer)->_vptr_Disposer)
                    (local_78.disposer,
                     ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
          pIVar5 = extraout_RDX_02;
        }
        pPVar1 = local_68.ptr;
        if (local_68.ptr != (PromiseNode *)0x0) {
          local_68.ptr = (PromiseNode *)0x0;
          (**((EventPort *)&(local_68.disposer)->_vptr_Disposer)->_vptr_EventPort)
                    (local_68.disposer,
                     pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
          pIVar5 = extraout_RDX_03;
        }
        goto LAB_0048db7e;
      }
    }
    local_78.disposer =
         (Disposer *)
         ((long)&local_58->_vptr_Disposer + (long)&(pPVar3 + -10)[10]._vptr_PromiseFulfiller);
  }
  else {
    if (iVar6 != 5) goto LAB_0048db7e;
LAB_0048db55:
    local_78.disposer = local_58;
  }
  OVar9 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                    ((kj *)&local_48,(unsigned_long *)&local_78);
  pIVar5 = OVar9.ptr;
  (pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_48;
  (pAVar7->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)uStack_40;
LAB_0048db7e:
  PVar11.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)pAVar7;
  return (Promise<unsigned_long>)PVar11.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryReadInternal(void* buffer, size_t minBytes, size_t maxBytes,
                                  size_t alreadyRead) {
    // `alreadyRead` is the number of bytes we have already received via previous reads -- minBytes,
    // maxBytes, and buffer have already been adjusted to account for them, but this count must
    // be included in the final return value.

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::read(fd, buffer, maxBytes)) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return alreadyRead;
    }

    if (n < 0) {
      // Read would block.
      return observer.whenBecomesReadable().then([=]() {
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      });
    } else if (n == 0) {
      // EOF -OR- maxBytes == 0.
      return alreadyRead;
    } else if (implicitCast<size_t>(n) >= minBytes) {
      // We read enough to stop here.
      return alreadyRead + n;
    } else {
      // The kernel returned fewer bytes than we asked for (and fewer than we need).

      buffer = reinterpret_cast<byte*>(buffer) + n;
      minBytes -= n;
      maxBytes -= n;
      alreadyRead += n;

      KJ_IF_MAYBE(atEnd, observer.atEndHint()) {
        if (*atEnd) {
          // We've already received an indication that the next read() will return EOF, so there's
          // nothing to wait for.
          return alreadyRead;
        } else {
          // As of the last time the event queue was checked, the kernel reported that we were
          // *not* at the end of the stream. It's unlikely that this has changed in the short time
          // it took to handle the event, therefore calling read() now will almost certainly fail
          // with EAGAIN. Moreover, since EOF had not been received as of the last check, we know
          // that even if it was received since then, whenBecomesReadable() will catch that. So,
          // let's go ahead and skip calling read() here and instead go straight to waiting for
          // more input.
          return observer.whenBecomesReadable().then([=]() {
            return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
          });
        }
      } else {
        // The kernel has not indicated one way or the other whether we are likely to be at EOF.
        // In this case we *must* keep calling read() until we either get a return of zero or
        // EAGAIN.
        return tryReadInternal(buffer, minBytes, maxBytes, alreadyRead);
      }
    }